

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

char * buffer_flatten(Buffer *buffer)

{
  char *pcVar1;
  BufferBlock *next;
  char *ptr;
  BufferBlock *item;
  char *retval;
  Buffer *buffer_local;
  
  buffer_local = (Buffer *)(*buffer->m)((int)buffer->total_bytes + 1,buffer->d);
  if (buffer_local == (Buffer *)0x0) {
    buffer_local = (Buffer *)0x0;
  }
  else {
    next = (BufferBlock *)buffer_local;
    ptr = (char *)buffer->head;
    while (ptr != (char *)0x0) {
      pcVar1 = *(char **)(ptr + 0x10);
      memcpy(next,*(void **)ptr,*(size_t *)(ptr + 8));
      next = (BufferBlock *)((long)&next->data + *(long *)(ptr + 8));
      (*buffer->f)(ptr,buffer->d);
      ptr = pcVar1;
    }
    *(undefined1 *)&next->data = 0;
    if (next != (BufferBlock *)((long)&buffer_local->total_bytes + buffer->total_bytes)) {
      __assert_fail("ptr == (retval + buffer->total_bytes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_common.c"
                    ,0x365,"char *buffer_flatten(Buffer *)");
    }
    buffer->tail = (BufferBlock *)0x0;
    buffer->head = (BufferBlock *)0x0;
    buffer->total_bytes = 0;
  }
  return (char *)buffer_local;
}

Assistant:

char *buffer_flatten(Buffer *buffer)
{
    char *retval = (char *) buffer->m(buffer->total_bytes + 1, buffer->d);
    if (retval == NULL)
        return NULL;
    BufferBlock *item = buffer->head;
    char *ptr = retval;
    while (item != NULL)
    {
        BufferBlock *next = item->next;
        memcpy(ptr, item->data, item->bytes);
        ptr += item->bytes;
        buffer->f(item, buffer->d);
        item = next;
    } // while
    *ptr = '\0';

    assert(ptr == (retval + buffer->total_bytes));

    buffer->head = buffer->tail = NULL;
    buffer->total_bytes = 0;

    return retval;
}